

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

unique_ptr<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>_>
_IPC_Decoder<perfetto::protos::gen::ObserveEventsRequest>(string *proto_data)

{
  int iVar1;
  ObserveEventsRequest *this;
  ObserveEventsRequest *pOVar2;
  undefined8 *in_RSI;
  
  this = (ObserveEventsRequest *)operator_new(0x48);
  perfetto::protos::gen::ObserveEventsRequest::ObserveEventsRequest(this);
  iVar1 = (*(this->super_CppMessageObj)._vptr_CppMessageObj[4])(this,*in_RSI,in_RSI[1]);
  if ((char)iVar1 == '\0') {
    (proto_data->_M_dataplus)._M_p = (pointer)0x0;
    pOVar2 = (ObserveEventsRequest *)0x0;
  }
  else {
    pOVar2 = this;
    this = (ObserveEventsRequest *)0x0;
  }
  (proto_data->_M_dataplus)._M_p = (pointer)pOVar2;
  if (this != (ObserveEventsRequest *)0x0) {
    (*(this->super_CppMessageObj)._vptr_CppMessageObj[1])(this);
  }
  return (__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
          )(__uniq_ptr_data<protozero::CppMessageObj,_std::default_delete<protozero::CppMessageObj>,_true,_true>
            )proto_data;
}

Assistant:

::std::unique_ptr<::perfetto::ipc::ProtoMessage> _IPC_Decoder(
    const std::string& proto_data) {
  ::std::unique_ptr<::perfetto::ipc::ProtoMessage> msg(new T());
  if (msg->ParseFromString(proto_data))
    return msg;
  return nullptr;
}